

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O1

commonNaNT * float128ToCommonNaN(commonNaNT *__return_storage_ptr__,float128 a,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = a.high;
  uVar2 = a.low;
  if (status->snan_bit_is_one == '\0') {
    if ((uVar1 & 0x7fff800000000000) != 0x7fff000000000000) goto LAB_0092f832;
    uVar3 = 0x7fffffffffff;
  }
  else {
    if ((a.high._4_4_ >> 0xf & 0xffff) < 0xffff) goto LAB_0092f832;
    uVar3 = 0xffffffffffff;
  }
  if ((uVar3 & uVar1) != 0 || uVar2 != 0) {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
LAB_0092f832:
  __return_storage_ptr__->sign = a.high._7_1_ >> 7;
  __return_storage_ptr__->low = uVar2 << 0x10;
  __return_storage_ptr__->high = uVar1 << 0x10 | uVar2 >> 0x30;
  return __return_storage_ptr__;
}

Assistant:

static commonNaNT float128ToCommonNaN(float128 a, float_status *status)
{
    commonNaNT z;

    if (float128_is_signaling_nan(a, status)) {
        float_raise(float_flag_invalid, status);
    }
    z.sign = a.high >> 63;
    shortShift128Left(a.high, a.low, 16, &z.high, &z.low);
    return z;
}